

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::getUseSparse(Result *__return_storage_ptr__,OneHotEncoder *this,bool *state)

{
  Model *this_00;
  OneHotEncoder *this_01;
  
  if (state != (bool *)0x0) {
    this_00 = (this->super_Model).m_spec.
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00->_oneof_case_[0] != 600) {
      Specification::Model::clear_Type(this_00);
      this_00->_oneof_case_[0] = 600;
      this_01 = (OneHotEncoder *)operator_new(0x28);
      Specification::OneHotEncoder::OneHotEncoder(this_01);
      (this_00->Type_).onehotencoder_ = this_01;
    }
    *state = ((this_00->Type_).onehotencoder_)->outputsparse_;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getUseSparse(bool *state) {
        if (state != nullptr) {
            auto ohe = m_spec->mutable_onehotencoder();
            *state = ohe->outputsparse();
        }
        return Result();
    }